

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ed25519-donna-impl-base.h
# Opt level: O0

void ge25519_nielsadd2(ge25519 *r,ge25519_niels *q)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  undefined1 auVar265 [16];
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  undefined1 auVar269 [16];
  undefined1 auVar270 [16];
  undefined1 auVar271 [16];
  undefined1 auVar272 [16];
  undefined1 auVar273 [16];
  undefined1 auVar274 [16];
  undefined1 auVar275 [16];
  undefined1 auVar276 [16];
  undefined1 auVar277 [16];
  undefined1 auVar278 [16];
  undefined1 auVar279 [16];
  undefined1 auVar280 [16];
  undefined1 auVar281 [16];
  undefined1 auVar282 [16];
  undefined1 auVar283 [16];
  undefined1 auVar284 [16];
  undefined1 auVar285 [16];
  undefined1 auVar286 [16];
  undefined1 auVar287 [16];
  undefined1 auVar288 [16];
  undefined1 auVar289 [16];
  undefined1 auVar290 [16];
  undefined1 auVar291 [16];
  undefined1 auVar292 [16];
  undefined1 auVar293 [16];
  undefined1 auVar294 [16];
  undefined1 auVar295 [16];
  undefined1 auVar296 [16];
  undefined1 auVar297 [16];
  undefined1 auVar298 [16];
  undefined1 auVar299 [16];
  undefined1 auVar300 [16];
  undefined1 auVar301 [16];
  undefined1 auVar302 [16];
  undefined1 auVar303 [16];
  undefined1 auVar304 [16];
  undefined1 auVar305 [16];
  undefined1 auVar306 [16];
  undefined1 auVar307 [16];
  undefined1 auVar308 [16];
  undefined1 auVar309 [16];
  undefined1 auVar310 [16];
  undefined1 auVar311 [16];
  undefined1 auVar312 [16];
  undefined1 auVar313 [16];
  undefined1 auVar314 [16];
  undefined1 auVar315 [16];
  undefined1 auVar316 [16];
  undefined1 auVar317 [16];
  undefined1 auVar318 [16];
  undefined1 auVar319 [16];
  undefined1 auVar320 [16];
  undefined1 auVar321 [16];
  undefined1 auVar322 [16];
  undefined1 auVar323 [16];
  undefined1 auVar324 [16];
  undefined1 auVar325 [16];
  undefined1 auVar326 [16];
  undefined1 auVar327 [16];
  undefined1 auVar328 [16];
  undefined1 auVar329 [16];
  undefined1 auVar330 [16];
  undefined1 auVar331 [16];
  undefined1 auVar332 [16];
  undefined1 auVar333 [16];
  undefined1 auVar334 [16];
  undefined1 auVar335 [16];
  undefined1 auVar336 [16];
  undefined1 auVar337 [16];
  undefined1 auVar338 [16];
  undefined1 auVar339 [16];
  undefined1 auVar340 [16];
  undefined1 auVar341 [16];
  undefined1 auVar342 [16];
  undefined1 auVar343 [16];
  undefined1 auVar344 [16];
  undefined1 auVar345 [16];
  undefined1 auVar346 [16];
  undefined1 auVar347 [16];
  undefined1 auVar348 [16];
  undefined1 auVar349 [16];
  undefined1 auVar350 [16];
  undefined1 auVar351 [16];
  undefined1 auVar352 [16];
  undefined1 auVar353 [16];
  undefined1 auVar354 [16];
  undefined1 auVar355 [16];
  undefined1 auVar356 [16];
  undefined1 auVar357 [16];
  undefined1 auVar358 [16];
  undefined1 auVar359 [16];
  undefined1 auVar360 [16];
  undefined1 auVar361 [16];
  undefined1 auVar362 [16];
  undefined1 auVar363 [16];
  undefined1 auVar364 [16];
  undefined1 auVar365 [16];
  undefined1 auVar366 [16];
  undefined1 auVar367 [16];
  undefined1 auVar368 [16];
  undefined1 auVar369 [16];
  undefined1 auVar370 [16];
  undefined1 auVar371 [16];
  undefined1 auVar372 [16];
  undefined1 auVar373 [16];
  undefined1 auVar374 [16];
  undefined1 auVar375 [16];
  undefined1 auVar376 [16];
  undefined1 auVar377 [16];
  undefined1 auVar378 [16];
  long lVar379;
  ulong uVar380;
  ulong uVar381;
  ulong uVar382;
  ulong uVar383;
  ulong uVar384;
  ulong uVar385;
  ulong uVar386;
  ulong uVar387;
  ulong uVar388;
  ulong uVar389;
  ulong uVar390;
  ulong uVar391;
  ulong uVar392;
  ulong uVar393;
  long lVar394;
  long lVar395;
  long lVar396;
  long lVar397;
  long lVar398;
  ulong uVar399;
  ulong uVar400;
  ulong uVar401;
  ulong uVar402;
  ulong uVar403;
  ulong uVar404;
  ulong uVar405;
  ulong uVar406;
  ulong uVar407;
  ulong uVar408;
  ulong uVar409;
  bignum25519 h;
  bignum25519 g;
  bignum25519 f;
  bignum25519 e;
  bignum25519 c;
  bignum25519 b;
  bignum25519 a;
  ge25519_niels *q_local;
  ge25519 *r_local;
  uint64_t c_7;
  uint64_t s4_6;
  uint64_t s3_6;
  uint64_t s2_6;
  uint64_t s1_6;
  uint64_t s0_6;
  uint64_t r4_6;
  uint64_t r3_6;
  uint64_t r2_6;
  uint64_t r1_6;
  uint64_t r0_6;
  uint128_t t_6 [5];
  uint64_t c_6;
  uint64_t s4_5;
  uint64_t s3_5;
  uint64_t s2_5;
  uint64_t s1_5;
  uint64_t s0_5;
  uint64_t r4_5;
  uint64_t r3_5;
  uint64_t r2_5;
  uint64_t r1_5;
  uint64_t r0_5;
  uint128_t t_5 [5];
  uint64_t c_5;
  uint64_t s4_4;
  uint64_t s3_4;
  uint64_t s2_4;
  uint64_t s1_4;
  uint64_t s0_4;
  uint64_t r4_4;
  uint64_t r3_4;
  uint64_t r2_4;
  uint64_t r1_4;
  uint64_t r0_4;
  uint128_t t_4 [5];
  uint64_t c_4;
  uint64_t s4_3;
  uint64_t s3_3;
  uint64_t s2_3;
  uint64_t s1_3;
  uint64_t s0_3;
  uint64_t r4_3;
  uint64_t r3_3;
  uint64_t r2_3;
  uint64_t r1_3;
  uint64_t r0_3;
  uint128_t t_3 [5];
  uint64_t c_3;
  uint64_t s4_2;
  uint64_t s3_2;
  uint64_t s2_2;
  uint64_t s1_2;
  uint64_t s0_2;
  uint64_t r4_2;
  uint64_t r3_2;
  uint64_t r2_2;
  uint64_t r1_2;
  uint64_t r0_2;
  uint128_t t_2 [5];
  uint64_t c_2;
  uint64_t s4_1;
  uint64_t s3_1;
  uint64_t s2_1;
  uint64_t s1_1;
  uint64_t s0_1;
  uint64_t r4_1;
  uint64_t r3_1;
  uint64_t r2_1;
  uint64_t r1_1;
  uint64_t r0_1;
  uint128_t t_1 [5];
  uint64_t c_1;
  uint64_t s4;
  uint64_t s3;
  uint64_t s2;
  uint64_t s1;
  uint64_t s0;
  uint64_t r4;
  uint64_t r3;
  uint64_t r2;
  uint64_t r1;
  uint64_t r0;
  uint128_t t [5];
  
  uVar380 = (r->y[0] - r->x[0]) + 0xfffffffffffda;
  uVar387 = (r->y[1] - r->x[1]) + 0xffffffffffffe;
  uVar388 = (r->y[2] - r->x[2]) + 0xffffffffffffe;
  uVar389 = (r->y[3] - r->x[3]) + 0xffffffffffffe;
  uVar381 = (r->y[4] - r->x[4]) + 0xffffffffffffe;
  uVar382 = r->y[0] + r->x[0];
  uVar383 = r->y[1] + r->x[1];
  uVar384 = r->y[2] + r->x[2];
  uVar385 = r->y[3] + r->x[3];
  uVar386 = r->y[4] + r->x[4];
  uVar393 = q->ysubx[0];
  uVar392 = q->ysubx[1];
  uVar405 = q->ysubx[2];
  uVar406 = q->ysubx[3];
  auVar1._8_8_ = 0;
  auVar1._0_8_ = uVar393;
  auVar176._8_8_ = 0;
  auVar176._0_8_ = uVar380;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = uVar393;
  auVar177._8_8_ = 0;
  auVar177._0_8_ = uVar387;
  auVar3._8_8_ = 0;
  auVar3._0_8_ = uVar392;
  auVar178._8_8_ = 0;
  auVar178._0_8_ = uVar380;
  auVar4._8_8_ = 0;
  auVar4._0_8_ = uVar393;
  auVar179._8_8_ = 0;
  auVar179._0_8_ = uVar388;
  auVar5._8_8_ = 0;
  auVar5._0_8_ = uVar405;
  auVar180._8_8_ = 0;
  auVar180._0_8_ = uVar380;
  auVar6._8_8_ = 0;
  auVar6._0_8_ = uVar392;
  auVar181._8_8_ = 0;
  auVar181._0_8_ = uVar387;
  auVar7._8_8_ = 0;
  auVar7._0_8_ = uVar393;
  auVar182._8_8_ = 0;
  auVar182._0_8_ = uVar389;
  auVar8._8_8_ = 0;
  auVar8._0_8_ = uVar406;
  auVar183._8_8_ = 0;
  auVar183._0_8_ = uVar380;
  auVar9._8_8_ = 0;
  auVar9._0_8_ = uVar392;
  auVar184._8_8_ = 0;
  auVar184._0_8_ = uVar388;
  auVar10._8_8_ = 0;
  auVar10._0_8_ = uVar405;
  auVar185._8_8_ = 0;
  auVar185._0_8_ = uVar387;
  auVar11._8_8_ = 0;
  auVar11._0_8_ = uVar393;
  auVar186._8_8_ = 0;
  auVar186._0_8_ = uVar381;
  auVar12._8_8_ = 0;
  auVar12._0_8_ = q->ysubx[4];
  auVar187._8_8_ = 0;
  auVar187._0_8_ = uVar380;
  auVar13._8_8_ = 0;
  auVar13._0_8_ = uVar406;
  auVar188._8_8_ = 0;
  auVar188._0_8_ = uVar387;
  auVar14._8_8_ = 0;
  auVar14._0_8_ = uVar392;
  auVar189._8_8_ = 0;
  auVar189._0_8_ = uVar389;
  auVar15._8_8_ = 0;
  auVar15._0_8_ = uVar405;
  auVar190._8_8_ = 0;
  auVar190._0_8_ = uVar388;
  uVar406 = uVar406 * 0x13;
  uVar393 = q->ysubx[4] * 0x13;
  auVar16._8_8_ = 0;
  auVar16._0_8_ = uVar393;
  auVar191._8_8_ = 0;
  auVar191._0_8_ = uVar387;
  auVar17._8_8_ = 0;
  auVar17._0_8_ = uVar392 * 0x13;
  auVar192._8_8_ = 0;
  auVar192._0_8_ = uVar381;
  auVar18._8_8_ = 0;
  auVar18._0_8_ = uVar405 * 0x13;
  auVar193._8_8_ = 0;
  auVar193._0_8_ = uVar389;
  auVar19._8_8_ = 0;
  auVar19._0_8_ = uVar406;
  auVar194._8_8_ = 0;
  auVar194._0_8_ = uVar388;
  auVar1 = auVar19 * auVar194 + auVar18 * auVar193 + auVar17 * auVar192 + auVar16 * auVar191 +
           auVar1 * auVar176;
  auVar20._8_8_ = 0;
  auVar20._0_8_ = uVar393;
  auVar195._8_8_ = 0;
  auVar195._0_8_ = uVar388;
  auVar21._8_8_ = 0;
  auVar21._0_8_ = uVar405 * 0x13;
  auVar196._8_8_ = 0;
  auVar196._0_8_ = uVar381;
  auVar22._8_8_ = 0;
  auVar22._0_8_ = uVar406;
  auVar197._8_8_ = 0;
  auVar197._0_8_ = uVar389;
  auVar23._8_8_ = 0;
  auVar23._0_8_ = uVar393;
  auVar198._8_8_ = 0;
  auVar198._0_8_ = uVar389;
  auVar24._8_8_ = 0;
  auVar24._0_8_ = uVar406;
  auVar199._8_8_ = 0;
  auVar199._0_8_ = uVar381;
  auVar25._8_8_ = 0;
  auVar25._0_8_ = uVar393;
  auVar200._8_8_ = 0;
  auVar200._0_8_ = uVar381;
  r0 = auVar1._0_8_;
  t[0]._0_8_ = auVar1._8_8_;
  auVar351._8_8_ = 0;
  auVar351._0_8_ = (long)t[0] << 0xd | r0 >> 0x33;
  auVar351 = auVar22 * auVar197 + auVar21 * auVar196 + auVar20 * auVar195 +
             auVar3 * auVar178 + auVar2 * auVar177 + auVar351;
  uVar392 = auVar351._0_8_;
  auVar352._8_8_ = 0;
  auVar352._0_8_ = auVar351._8_8_ << 0xd | uVar392 >> 0x33;
  auVar352 = auVar24 * auVar199 + auVar23 * auVar198 +
             auVar6 * auVar181 + auVar5 * auVar180 + auVar4 * auVar179 + auVar352;
  uVar393 = auVar352._0_8_;
  uVar380 = uVar393 & 0x7ffffffffffff;
  auVar353._8_8_ = 0;
  auVar353._0_8_ = auVar352._8_8_ << 0xd | uVar393 >> 0x33;
  auVar353 = auVar25 * auVar200 +
             auVar10 * auVar185 + auVar9 * auVar184 + auVar8 * auVar183 + auVar7 * auVar182 +
             auVar353;
  uVar393 = auVar353._0_8_;
  uVar381 = uVar393 & 0x7ffffffffffff;
  auVar354._8_8_ = 0;
  auVar354._0_8_ = auVar353._8_8_ << 0xd | uVar393 >> 0x33;
  auVar354 = auVar15 * auVar190 +
             auVar14 * auVar189 + auVar13 * auVar188 + auVar12 * auVar187 + auVar11 * auVar186 +
             auVar354;
  uVar393 = auVar354._0_8_;
  uVar387 = uVar393 & 0x7ffffffffffff;
  uVar393 = (r0 & 0x7ffffffffffff) + (auVar354._8_8_ << 0xd | uVar393 >> 0x33) * 0x13;
  r1 = uVar393 & 0x7ffffffffffff;
  lVar379 = (uVar392 & 0x7ffffffffffff) + (uVar393 >> 0x33);
  uVar393 = q->xaddy[0];
  uVar392 = q->xaddy[1];
  uVar405 = q->xaddy[2];
  uVar406 = q->xaddy[3];
  auVar26._8_8_ = 0;
  auVar26._0_8_ = uVar393;
  auVar201._8_8_ = 0;
  auVar201._0_8_ = uVar382;
  auVar27._8_8_ = 0;
  auVar27._0_8_ = uVar393;
  auVar202._8_8_ = 0;
  auVar202._0_8_ = uVar383;
  auVar28._8_8_ = 0;
  auVar28._0_8_ = uVar392;
  auVar203._8_8_ = 0;
  auVar203._0_8_ = uVar382;
  auVar29._8_8_ = 0;
  auVar29._0_8_ = uVar393;
  auVar204._8_8_ = 0;
  auVar204._0_8_ = uVar384;
  auVar30._8_8_ = 0;
  auVar30._0_8_ = uVar405;
  auVar205._8_8_ = 0;
  auVar205._0_8_ = uVar382;
  auVar31._8_8_ = 0;
  auVar31._0_8_ = uVar392;
  auVar206._8_8_ = 0;
  auVar206._0_8_ = uVar383;
  auVar32._8_8_ = 0;
  auVar32._0_8_ = uVar393;
  auVar207._8_8_ = 0;
  auVar207._0_8_ = uVar385;
  auVar33._8_8_ = 0;
  auVar33._0_8_ = uVar406;
  auVar208._8_8_ = 0;
  auVar208._0_8_ = uVar382;
  auVar34._8_8_ = 0;
  auVar34._0_8_ = uVar392;
  auVar209._8_8_ = 0;
  auVar209._0_8_ = uVar384;
  auVar35._8_8_ = 0;
  auVar35._0_8_ = uVar405;
  auVar210._8_8_ = 0;
  auVar210._0_8_ = uVar383;
  auVar36._8_8_ = 0;
  auVar36._0_8_ = uVar393;
  auVar211._8_8_ = 0;
  auVar211._0_8_ = uVar386;
  auVar37._8_8_ = 0;
  auVar37._0_8_ = q->xaddy[4];
  auVar212._8_8_ = 0;
  auVar212._0_8_ = uVar382;
  auVar38._8_8_ = 0;
  auVar38._0_8_ = uVar406;
  auVar213._8_8_ = 0;
  auVar213._0_8_ = uVar383;
  auVar39._8_8_ = 0;
  auVar39._0_8_ = uVar392;
  auVar214._8_8_ = 0;
  auVar214._0_8_ = uVar385;
  auVar40._8_8_ = 0;
  auVar40._0_8_ = uVar405;
  auVar215._8_8_ = 0;
  auVar215._0_8_ = uVar384;
  uVar406 = uVar406 * 0x13;
  uVar393 = q->xaddy[4] * 0x13;
  auVar41._8_8_ = 0;
  auVar41._0_8_ = uVar393;
  auVar216._8_8_ = 0;
  auVar216._0_8_ = uVar383;
  auVar42._8_8_ = 0;
  auVar42._0_8_ = uVar392 * 0x13;
  auVar217._8_8_ = 0;
  auVar217._0_8_ = uVar386;
  auVar43._8_8_ = 0;
  auVar43._0_8_ = uVar405 * 0x13;
  auVar218._8_8_ = 0;
  auVar218._0_8_ = uVar385;
  auVar44._8_8_ = 0;
  auVar44._0_8_ = uVar406;
  auVar219._8_8_ = 0;
  auVar219._0_8_ = uVar384;
  auVar1 = auVar42 * auVar217 + auVar41 * auVar216 + auVar43 * auVar218 + auVar44 * auVar219 +
           auVar26 * auVar201;
  auVar45._8_8_ = 0;
  auVar45._0_8_ = uVar393;
  auVar220._8_8_ = 0;
  auVar220._0_8_ = uVar384;
  auVar46._8_8_ = 0;
  auVar46._0_8_ = uVar405 * 0x13;
  auVar221._8_8_ = 0;
  auVar221._0_8_ = uVar386;
  auVar47._8_8_ = 0;
  auVar47._0_8_ = uVar406;
  auVar222._8_8_ = 0;
  auVar222._0_8_ = uVar385;
  auVar48._8_8_ = 0;
  auVar48._0_8_ = uVar393;
  auVar223._8_8_ = 0;
  auVar223._0_8_ = uVar385;
  auVar49._8_8_ = 0;
  auVar49._0_8_ = uVar406;
  auVar224._8_8_ = 0;
  auVar224._0_8_ = uVar386;
  auVar50._8_8_ = 0;
  auVar50._0_8_ = uVar393;
  auVar225._8_8_ = 0;
  auVar225._0_8_ = uVar386;
  r0_1 = auVar1._0_8_;
  t_1[0]._0_8_ = auVar1._8_8_;
  auVar355._8_8_ = 0;
  auVar355._0_8_ = (long)t_1[0] << 0xd | r0_1 >> 0x33;
  auVar355 = auVar46 * auVar221 + auVar45 * auVar220 + auVar47 * auVar222 +
             auVar28 * auVar203 + auVar27 * auVar202 + auVar355;
  uVar382 = auVar355._0_8_;
  auVar356._8_8_ = 0;
  auVar356._0_8_ = auVar355._8_8_ << 0xd | uVar382 >> 0x33;
  auVar356 = auVar49 * auVar224 + auVar48 * auVar223 +
             auVar31 * auVar206 + auVar30 * auVar205 + auVar29 * auVar204 + auVar356;
  uVar392 = auVar356._0_8_;
  uVar393 = uVar392 & 0x7ffffffffffff;
  auVar357._8_8_ = 0;
  auVar357._0_8_ = auVar356._8_8_ << 0xd | uVar392 >> 0x33;
  auVar357 = auVar50 * auVar225 +
             auVar35 * auVar210 + auVar34 * auVar209 + auVar33 * auVar208 + auVar32 * auVar207 +
             auVar357;
  uVar405 = auVar357._0_8_;
  uVar392 = uVar405 & 0x7ffffffffffff;
  auVar358._8_8_ = 0;
  auVar358._0_8_ = auVar357._8_8_ << 0xd | uVar405 >> 0x33;
  auVar358 = auVar40 * auVar215 +
             auVar39 * auVar214 + auVar38 * auVar213 + auVar37 * auVar212 + auVar36 * auVar211 +
             auVar358;
  uVar406 = auVar358._0_8_;
  uVar405 = uVar406 & 0x7ffffffffffff;
  uVar406 = (r0_1 & 0x7ffffffffffff) + (auVar358._8_8_ << 0xd | uVar406 >> 0x33) * 0x13;
  r1_1 = uVar406 & 0x7ffffffffffff;
  lVar394 = (uVar382 & 0x7ffffffffffff) + (uVar406 >> 0x33);
  uVar407 = r1_1 + r1;
  uVar408 = lVar394 + lVar379;
  uVar409 = uVar393 + uVar380;
  uVar384 = uVar392 + uVar381;
  uVar385 = uVar405 + uVar387;
  uVar388 = (r1_1 - r1) + 0xfffffffffffda;
  uVar389 = (lVar394 - lVar379) + 0xffffffffffffe;
  uVar390 = (uVar393 - uVar380) + 0xffffffffffffe;
  uVar391 = (uVar392 - uVar381) + 0xffffffffffffe;
  uVar386 = (uVar405 - uVar387) + 0xffffffffffffe;
  uVar393 = q->t2d[0];
  uVar392 = q->t2d[1];
  uVar405 = q->t2d[2];
  uVar406 = q->t2d[3];
  uVar380 = r->t[0];
  uVar381 = r->t[1];
  uVar387 = r->t[2];
  uVar382 = r->t[3];
  uVar383 = r->t[4];
  auVar51._8_8_ = 0;
  auVar51._0_8_ = uVar393;
  auVar226._8_8_ = 0;
  auVar226._0_8_ = uVar380;
  auVar52._8_8_ = 0;
  auVar52._0_8_ = uVar393;
  auVar227._8_8_ = 0;
  auVar227._0_8_ = uVar381;
  auVar53._8_8_ = 0;
  auVar53._0_8_ = uVar392;
  auVar228._8_8_ = 0;
  auVar228._0_8_ = uVar380;
  auVar54._8_8_ = 0;
  auVar54._0_8_ = uVar393;
  auVar229._8_8_ = 0;
  auVar229._0_8_ = uVar387;
  auVar55._8_8_ = 0;
  auVar55._0_8_ = uVar405;
  auVar230._8_8_ = 0;
  auVar230._0_8_ = uVar380;
  auVar56._8_8_ = 0;
  auVar56._0_8_ = uVar392;
  auVar231._8_8_ = 0;
  auVar231._0_8_ = uVar381;
  auVar57._8_8_ = 0;
  auVar57._0_8_ = uVar393;
  auVar232._8_8_ = 0;
  auVar232._0_8_ = uVar382;
  auVar58._8_8_ = 0;
  auVar58._0_8_ = uVar406;
  auVar233._8_8_ = 0;
  auVar233._0_8_ = uVar380;
  auVar59._8_8_ = 0;
  auVar59._0_8_ = uVar392;
  auVar234._8_8_ = 0;
  auVar234._0_8_ = uVar387;
  auVar60._8_8_ = 0;
  auVar60._0_8_ = uVar405;
  auVar235._8_8_ = 0;
  auVar235._0_8_ = uVar381;
  auVar61._8_8_ = 0;
  auVar61._0_8_ = uVar393;
  auVar236._8_8_ = 0;
  auVar236._0_8_ = uVar383;
  auVar62._8_8_ = 0;
  auVar62._0_8_ = q->t2d[4];
  auVar237._8_8_ = 0;
  auVar237._0_8_ = uVar380;
  auVar63._8_8_ = 0;
  auVar63._0_8_ = uVar406;
  auVar238._8_8_ = 0;
  auVar238._0_8_ = uVar381;
  auVar64._8_8_ = 0;
  auVar64._0_8_ = uVar392;
  auVar239._8_8_ = 0;
  auVar239._0_8_ = uVar382;
  auVar65._8_8_ = 0;
  auVar65._0_8_ = uVar405;
  auVar240._8_8_ = 0;
  auVar240._0_8_ = uVar387;
  uVar406 = uVar406 * 0x13;
  uVar393 = q->t2d[4] * 0x13;
  auVar66._8_8_ = 0;
  auVar66._0_8_ = uVar393;
  auVar241._8_8_ = 0;
  auVar241._0_8_ = uVar381;
  auVar67._8_8_ = 0;
  auVar67._0_8_ = uVar392 * 0x13;
  auVar242._8_8_ = 0;
  auVar242._0_8_ = uVar383;
  auVar68._8_8_ = 0;
  auVar68._0_8_ = uVar405 * 0x13;
  auVar243._8_8_ = 0;
  auVar243._0_8_ = uVar382;
  auVar69._8_8_ = 0;
  auVar69._0_8_ = uVar406;
  auVar244._8_8_ = 0;
  auVar244._0_8_ = uVar387;
  auVar1 = auVar67 * auVar242 + auVar66 * auVar241 + auVar68 * auVar243 + auVar69 * auVar244 +
           auVar51 * auVar226;
  auVar70._8_8_ = 0;
  auVar70._0_8_ = uVar393;
  auVar245._8_8_ = 0;
  auVar245._0_8_ = uVar387;
  auVar71._8_8_ = 0;
  auVar71._0_8_ = uVar405 * 0x13;
  auVar246._8_8_ = 0;
  auVar246._0_8_ = uVar383;
  auVar72._8_8_ = 0;
  auVar72._0_8_ = uVar406;
  auVar247._8_8_ = 0;
  auVar247._0_8_ = uVar382;
  auVar73._8_8_ = 0;
  auVar73._0_8_ = uVar393;
  auVar248._8_8_ = 0;
  auVar248._0_8_ = uVar382;
  auVar74._8_8_ = 0;
  auVar74._0_8_ = uVar406;
  auVar249._8_8_ = 0;
  auVar249._0_8_ = uVar383;
  auVar75._8_8_ = 0;
  auVar75._0_8_ = uVar393;
  auVar250._8_8_ = 0;
  auVar250._0_8_ = uVar383;
  r0_2 = auVar1._0_8_;
  t_2[0]._0_8_ = auVar1._8_8_;
  auVar359._8_8_ = 0;
  auVar359._0_8_ = (long)t_2[0] << 0xd | r0_2 >> 0x33;
  auVar359 = auVar71 * auVar246 + auVar70 * auVar245 + auVar72 * auVar247 +
             auVar53 * auVar228 + auVar52 * auVar227 + auVar359;
  uVar380 = auVar359._0_8_;
  auVar360._8_8_ = 0;
  auVar360._0_8_ = auVar359._8_8_ << 0xd | uVar380 >> 0x33;
  auVar360 = auVar74 * auVar249 + auVar73 * auVar248 +
             auVar56 * auVar231 + auVar55 * auVar230 + auVar54 * auVar229 + auVar360;
  uVar392 = auVar360._0_8_;
  uVar393 = uVar392 & 0x7ffffffffffff;
  auVar361._8_8_ = 0;
  auVar361._0_8_ = auVar360._8_8_ << 0xd | uVar392 >> 0x33;
  auVar361 = auVar75 * auVar250 +
             auVar60 * auVar235 + auVar59 * auVar234 + auVar58 * auVar233 + auVar57 * auVar232 +
             auVar361;
  uVar405 = auVar361._0_8_;
  uVar392 = uVar405 & 0x7ffffffffffff;
  auVar362._8_8_ = 0;
  auVar362._0_8_ = auVar361._8_8_ << 0xd | uVar405 >> 0x33;
  auVar362 = auVar65 * auVar240 +
             auVar64 * auVar239 + auVar63 * auVar238 + auVar62 * auVar237 + auVar61 * auVar236 +
             auVar362;
  uVar405 = auVar362._0_8_;
  uVar406 = uVar405 & 0x7ffffffffffff;
  uVar405 = (r0_2 & 0x7ffffffffffff) + (auVar362._8_8_ << 0xd | uVar405 >> 0x33) * 0x13;
  r1_2 = uVar405 & 0x7ffffffffffff;
  lVar379 = (uVar380 & 0x7ffffffffffff) + (uVar405 >> 0x33);
  lVar394 = r->z[0] + r->z[0];
  lVar395 = r->z[1] + r->z[1];
  lVar396 = r->z[2] + r->z[2];
  lVar397 = r->z[3] + r->z[3];
  lVar398 = r->z[4] + r->z[4];
  uVar383 = lVar394 + r1_2;
  uVar399 = lVar395 + lVar379;
  uVar400 = lVar396 + uVar393;
  uVar401 = lVar397 + uVar392;
  uVar402 = lVar398 + uVar406;
  uVar380 = (lVar394 - r1_2) + 0x1fffffffffffb4;
  uVar403 = (lVar395 - lVar379) + 0x1ffffffffffffc;
  uVar404 = (lVar396 - uVar393) + 0x1ffffffffffffc;
  uVar405 = (lVar397 - uVar392) + 0x1ffffffffffffc;
  uVar406 = (lVar398 - uVar406) + 0x1ffffffffffffc;
  auVar76._8_8_ = 0;
  auVar76._0_8_ = uVar380;
  auVar251._8_8_ = 0;
  auVar251._0_8_ = uVar388;
  auVar77._8_8_ = 0;
  auVar77._0_8_ = uVar380;
  auVar252._8_8_ = 0;
  auVar252._0_8_ = uVar389;
  auVar78._8_8_ = 0;
  auVar78._0_8_ = uVar403;
  auVar253._8_8_ = 0;
  auVar253._0_8_ = uVar388;
  auVar79._8_8_ = 0;
  auVar79._0_8_ = uVar380;
  auVar254._8_8_ = 0;
  auVar254._0_8_ = uVar390;
  auVar80._8_8_ = 0;
  auVar80._0_8_ = uVar404;
  auVar255._8_8_ = 0;
  auVar255._0_8_ = uVar388;
  auVar81._8_8_ = 0;
  auVar81._0_8_ = uVar403;
  auVar256._8_8_ = 0;
  auVar256._0_8_ = uVar389;
  auVar82._8_8_ = 0;
  auVar82._0_8_ = uVar380;
  auVar257._8_8_ = 0;
  auVar257._0_8_ = uVar391;
  auVar83._8_8_ = 0;
  auVar83._0_8_ = uVar405;
  auVar258._8_8_ = 0;
  auVar258._0_8_ = uVar388;
  auVar84._8_8_ = 0;
  auVar84._0_8_ = uVar403;
  auVar259._8_8_ = 0;
  auVar259._0_8_ = uVar390;
  auVar85._8_8_ = 0;
  auVar85._0_8_ = uVar404;
  auVar260._8_8_ = 0;
  auVar260._0_8_ = uVar389;
  auVar86._8_8_ = 0;
  auVar86._0_8_ = uVar380;
  auVar261._8_8_ = 0;
  auVar261._0_8_ = uVar386;
  auVar87._8_8_ = 0;
  auVar87._0_8_ = uVar406;
  auVar262._8_8_ = 0;
  auVar262._0_8_ = uVar388;
  auVar88._8_8_ = 0;
  auVar88._0_8_ = uVar405;
  auVar263._8_8_ = 0;
  auVar263._0_8_ = uVar389;
  auVar89._8_8_ = 0;
  auVar89._0_8_ = uVar403;
  auVar264._8_8_ = 0;
  auVar264._0_8_ = uVar391;
  auVar90._8_8_ = 0;
  auVar90._0_8_ = uVar404;
  auVar265._8_8_ = 0;
  auVar265._0_8_ = uVar390;
  uVar393 = uVar405 * 0x13;
  uVar392 = uVar406 * 0x13;
  auVar91._8_8_ = 0;
  auVar91._0_8_ = uVar392;
  auVar266._8_8_ = 0;
  auVar266._0_8_ = uVar389;
  auVar92._8_8_ = 0;
  auVar92._0_8_ = uVar403 * 0x13;
  auVar267._8_8_ = 0;
  auVar267._0_8_ = uVar386;
  auVar93._8_8_ = 0;
  auVar93._0_8_ = uVar404 * 0x13;
  auVar268._8_8_ = 0;
  auVar268._0_8_ = uVar391;
  auVar94._8_8_ = 0;
  auVar94._0_8_ = uVar393;
  auVar269._8_8_ = 0;
  auVar269._0_8_ = uVar390;
  auVar1 = auVar92 * auVar267 + auVar91 * auVar266 + auVar93 * auVar268 + auVar94 * auVar269 +
           auVar76 * auVar251;
  auVar95._8_8_ = 0;
  auVar95._0_8_ = uVar392;
  auVar270._8_8_ = 0;
  auVar270._0_8_ = uVar390;
  auVar96._8_8_ = 0;
  auVar96._0_8_ = uVar404 * 0x13;
  auVar271._8_8_ = 0;
  auVar271._0_8_ = uVar386;
  auVar97._8_8_ = 0;
  auVar97._0_8_ = uVar393;
  auVar272._8_8_ = 0;
  auVar272._0_8_ = uVar391;
  auVar98._8_8_ = 0;
  auVar98._0_8_ = uVar392;
  auVar273._8_8_ = 0;
  auVar273._0_8_ = uVar391;
  auVar99._8_8_ = 0;
  auVar99._0_8_ = uVar393;
  auVar274._8_8_ = 0;
  auVar274._0_8_ = uVar386;
  auVar100._8_8_ = 0;
  auVar100._0_8_ = uVar392;
  auVar275._8_8_ = 0;
  auVar275._0_8_ = uVar386;
  r0_3 = auVar1._0_8_;
  t_3[0]._0_8_ = auVar1._8_8_;
  auVar363._8_8_ = 0;
  auVar363._0_8_ = (long)t_3[0] << 0xd | r0_3 >> 0x33;
  auVar363 = auVar96 * auVar271 + auVar95 * auVar270 + auVar97 * auVar272 +
             auVar78 * auVar253 + auVar77 * auVar252 + auVar363;
  uVar392 = auVar363._0_8_;
  auVar364._8_8_ = 0;
  auVar364._0_8_ = auVar363._8_8_ << 0xd | uVar392 >> 0x33;
  auVar364 = auVar99 * auVar274 + auVar98 * auVar273 +
             auVar81 * auVar256 + auVar80 * auVar255 + auVar79 * auVar254 + auVar364;
  uVar381 = auVar364._0_8_;
  auVar365._8_8_ = 0;
  auVar365._0_8_ = auVar364._8_8_ << 0xd | uVar381 >> 0x33;
  auVar365 = auVar100 * auVar275 +
             auVar85 * auVar260 + auVar84 * auVar259 + auVar83 * auVar258 + auVar82 * auVar257 +
             auVar365;
  uVar387 = auVar365._0_8_;
  auVar366._8_8_ = 0;
  auVar366._0_8_ = auVar365._8_8_ << 0xd | uVar387 >> 0x33;
  auVar366 = auVar90 * auVar265 +
             auVar89 * auVar264 + auVar88 * auVar263 + auVar87 * auVar262 + auVar86 * auVar261 +
             auVar366;
  uVar382 = auVar366._0_8_;
  uVar393 = (r0_3 & 0x7ffffffffffff) + (auVar366._8_8_ << 0xd | uVar382 >> 0x33) * 0x13;
  r1_3 = uVar393 & 0x7ffffffffffff;
  r->x[0] = r1_3;
  r->x[1] = (uVar392 & 0x7ffffffffffff) + (uVar393 >> 0x33);
  r->x[2] = uVar381 & 0x7ffffffffffff;
  r->x[3] = uVar387 & 0x7ffffffffffff;
  r->x[4] = uVar382 & 0x7ffffffffffff;
  auVar101._8_8_ = 0;
  auVar101._0_8_ = uVar383;
  auVar276._8_8_ = 0;
  auVar276._0_8_ = uVar407;
  auVar102._8_8_ = 0;
  auVar102._0_8_ = uVar383;
  auVar277._8_8_ = 0;
  auVar277._0_8_ = uVar408;
  auVar103._8_8_ = 0;
  auVar103._0_8_ = uVar399;
  auVar278._8_8_ = 0;
  auVar278._0_8_ = uVar407;
  auVar104._8_8_ = 0;
  auVar104._0_8_ = uVar383;
  auVar279._8_8_ = 0;
  auVar279._0_8_ = uVar409;
  auVar105._8_8_ = 0;
  auVar105._0_8_ = uVar400;
  auVar280._8_8_ = 0;
  auVar280._0_8_ = uVar407;
  auVar106._8_8_ = 0;
  auVar106._0_8_ = uVar399;
  auVar281._8_8_ = 0;
  auVar281._0_8_ = uVar408;
  auVar107._8_8_ = 0;
  auVar107._0_8_ = uVar383;
  auVar282._8_8_ = 0;
  auVar282._0_8_ = uVar384;
  auVar108._8_8_ = 0;
  auVar108._0_8_ = uVar401;
  auVar283._8_8_ = 0;
  auVar283._0_8_ = uVar407;
  auVar109._8_8_ = 0;
  auVar109._0_8_ = uVar399;
  auVar284._8_8_ = 0;
  auVar284._0_8_ = uVar409;
  auVar110._8_8_ = 0;
  auVar110._0_8_ = uVar400;
  auVar285._8_8_ = 0;
  auVar285._0_8_ = uVar408;
  auVar111._8_8_ = 0;
  auVar111._0_8_ = uVar383;
  auVar286._8_8_ = 0;
  auVar286._0_8_ = uVar385;
  auVar112._8_8_ = 0;
  auVar112._0_8_ = uVar402;
  auVar287._8_8_ = 0;
  auVar287._0_8_ = uVar407;
  auVar113._8_8_ = 0;
  auVar113._0_8_ = uVar401;
  auVar288._8_8_ = 0;
  auVar288._0_8_ = uVar408;
  auVar114._8_8_ = 0;
  auVar114._0_8_ = uVar399;
  auVar289._8_8_ = 0;
  auVar289._0_8_ = uVar384;
  auVar115._8_8_ = 0;
  auVar115._0_8_ = uVar400;
  auVar290._8_8_ = 0;
  auVar290._0_8_ = uVar409;
  uVar393 = uVar401 * 0x13;
  uVar392 = uVar402 * 0x13;
  auVar116._8_8_ = 0;
  auVar116._0_8_ = uVar392;
  auVar291._8_8_ = 0;
  auVar291._0_8_ = uVar408;
  auVar117._8_8_ = 0;
  auVar117._0_8_ = uVar399 * 0x13;
  auVar292._8_8_ = 0;
  auVar292._0_8_ = uVar385;
  auVar118._8_8_ = 0;
  auVar118._0_8_ = uVar400 * 0x13;
  auVar293._8_8_ = 0;
  auVar293._0_8_ = uVar384;
  auVar119._8_8_ = 0;
  auVar119._0_8_ = uVar393;
  auVar294._8_8_ = 0;
  auVar294._0_8_ = uVar409;
  auVar1 = auVar117 * auVar292 + auVar116 * auVar291 + auVar118 * auVar293 + auVar119 * auVar294 +
           auVar101 * auVar276;
  auVar120._8_8_ = 0;
  auVar120._0_8_ = uVar392;
  auVar295._8_8_ = 0;
  auVar295._0_8_ = uVar409;
  auVar121._8_8_ = 0;
  auVar121._0_8_ = uVar400 * 0x13;
  auVar296._8_8_ = 0;
  auVar296._0_8_ = uVar385;
  auVar122._8_8_ = 0;
  auVar122._0_8_ = uVar393;
  auVar297._8_8_ = 0;
  auVar297._0_8_ = uVar384;
  auVar123._8_8_ = 0;
  auVar123._0_8_ = uVar392;
  auVar298._8_8_ = 0;
  auVar298._0_8_ = uVar384;
  auVar124._8_8_ = 0;
  auVar124._0_8_ = uVar393;
  auVar299._8_8_ = 0;
  auVar299._0_8_ = uVar385;
  auVar125._8_8_ = 0;
  auVar125._0_8_ = uVar392;
  auVar300._8_8_ = 0;
  auVar300._0_8_ = uVar385;
  r0_4 = auVar1._0_8_;
  t_4[0]._0_8_ = auVar1._8_8_;
  auVar367._8_8_ = 0;
  auVar367._0_8_ = (long)t_4[0] << 0xd | r0_4 >> 0x33;
  auVar367 = auVar121 * auVar296 + auVar120 * auVar295 + auVar122 * auVar297 +
             auVar103 * auVar278 + auVar102 * auVar277 + auVar367;
  uVar392 = auVar367._0_8_;
  auVar368._8_8_ = 0;
  auVar368._0_8_ = auVar367._8_8_ << 0xd | uVar392 >> 0x33;
  auVar368 = auVar124 * auVar299 + auVar123 * auVar298 +
             auVar106 * auVar281 + auVar105 * auVar280 + auVar104 * auVar279 + auVar368;
  uVar381 = auVar368._0_8_;
  auVar369._8_8_ = 0;
  auVar369._0_8_ = auVar368._8_8_ << 0xd | uVar381 >> 0x33;
  auVar369 = auVar125 * auVar300 +
             auVar110 * auVar285 + auVar109 * auVar284 + auVar108 * auVar283 + auVar107 * auVar282 +
             auVar369;
  uVar387 = auVar369._0_8_;
  auVar370._8_8_ = 0;
  auVar370._0_8_ = auVar369._8_8_ << 0xd | uVar387 >> 0x33;
  auVar370 = auVar115 * auVar290 +
             auVar114 * auVar289 + auVar113 * auVar288 + auVar112 * auVar287 + auVar111 * auVar286 +
             auVar370;
  uVar382 = auVar370._0_8_;
  uVar393 = (r0_4 & 0x7ffffffffffff) + (auVar370._8_8_ << 0xd | uVar382 >> 0x33) * 0x13;
  r1_4 = uVar393 & 0x7ffffffffffff;
  r->y[0] = r1_4;
  r->y[1] = (uVar392 & 0x7ffffffffffff) + (uVar393 >> 0x33);
  r->y[2] = uVar381 & 0x7ffffffffffff;
  r->y[3] = uVar387 & 0x7ffffffffffff;
  r->y[4] = uVar382 & 0x7ffffffffffff;
  auVar126._8_8_ = 0;
  auVar126._0_8_ = uVar380;
  auVar301._8_8_ = 0;
  auVar301._0_8_ = uVar383;
  auVar127._8_8_ = 0;
  auVar127._0_8_ = uVar380;
  auVar302._8_8_ = 0;
  auVar302._0_8_ = uVar399;
  auVar128._8_8_ = 0;
  auVar128._0_8_ = uVar403;
  auVar303._8_8_ = 0;
  auVar303._0_8_ = uVar383;
  auVar129._8_8_ = 0;
  auVar129._0_8_ = uVar380;
  auVar304._8_8_ = 0;
  auVar304._0_8_ = uVar400;
  auVar130._8_8_ = 0;
  auVar130._0_8_ = uVar404;
  auVar305._8_8_ = 0;
  auVar305._0_8_ = uVar383;
  auVar131._8_8_ = 0;
  auVar131._0_8_ = uVar403;
  auVar306._8_8_ = 0;
  auVar306._0_8_ = uVar399;
  auVar132._8_8_ = 0;
  auVar132._0_8_ = uVar380;
  auVar307._8_8_ = 0;
  auVar307._0_8_ = uVar401;
  auVar133._8_8_ = 0;
  auVar133._0_8_ = uVar405;
  auVar308._8_8_ = 0;
  auVar308._0_8_ = uVar383;
  auVar134._8_8_ = 0;
  auVar134._0_8_ = uVar403;
  auVar309._8_8_ = 0;
  auVar309._0_8_ = uVar400;
  auVar135._8_8_ = 0;
  auVar135._0_8_ = uVar404;
  auVar310._8_8_ = 0;
  auVar310._0_8_ = uVar399;
  auVar136._8_8_ = 0;
  auVar136._0_8_ = uVar380;
  auVar311._8_8_ = 0;
  auVar311._0_8_ = uVar402;
  auVar137._8_8_ = 0;
  auVar137._0_8_ = uVar406;
  auVar312._8_8_ = 0;
  auVar312._0_8_ = uVar383;
  auVar138._8_8_ = 0;
  auVar138._0_8_ = uVar405;
  auVar313._8_8_ = 0;
  auVar313._0_8_ = uVar399;
  auVar139._8_8_ = 0;
  auVar139._0_8_ = uVar403;
  auVar314._8_8_ = 0;
  auVar314._0_8_ = uVar401;
  auVar140._8_8_ = 0;
  auVar140._0_8_ = uVar404;
  auVar315._8_8_ = 0;
  auVar315._0_8_ = uVar400;
  uVar405 = uVar405 * 0x13;
  uVar406 = uVar406 * 0x13;
  auVar141._8_8_ = 0;
  auVar141._0_8_ = uVar406;
  auVar316._8_8_ = 0;
  auVar316._0_8_ = uVar399;
  auVar142._8_8_ = 0;
  auVar142._0_8_ = uVar403 * 0x13;
  auVar317._8_8_ = 0;
  auVar317._0_8_ = uVar402;
  auVar143._8_8_ = 0;
  auVar143._0_8_ = uVar404 * 0x13;
  auVar318._8_8_ = 0;
  auVar318._0_8_ = uVar401;
  auVar144._8_8_ = 0;
  auVar144._0_8_ = uVar405;
  auVar319._8_8_ = 0;
  auVar319._0_8_ = uVar400;
  auVar1 = auVar142 * auVar317 + auVar141 * auVar316 + auVar143 * auVar318 + auVar144 * auVar319 +
           auVar126 * auVar301;
  auVar145._8_8_ = 0;
  auVar145._0_8_ = uVar406;
  auVar320._8_8_ = 0;
  auVar320._0_8_ = uVar400;
  auVar146._8_8_ = 0;
  auVar146._0_8_ = uVar404 * 0x13;
  auVar321._8_8_ = 0;
  auVar321._0_8_ = uVar402;
  auVar147._8_8_ = 0;
  auVar147._0_8_ = uVar405;
  auVar322._8_8_ = 0;
  auVar322._0_8_ = uVar401;
  auVar148._8_8_ = 0;
  auVar148._0_8_ = uVar406;
  auVar323._8_8_ = 0;
  auVar323._0_8_ = uVar401;
  auVar149._8_8_ = 0;
  auVar149._0_8_ = uVar405;
  auVar324._8_8_ = 0;
  auVar324._0_8_ = uVar402;
  auVar150._8_8_ = 0;
  auVar150._0_8_ = uVar406;
  auVar325._8_8_ = 0;
  auVar325._0_8_ = uVar402;
  r0_5 = auVar1._0_8_;
  t_5[0]._0_8_ = auVar1._8_8_;
  auVar371._8_8_ = 0;
  auVar371._0_8_ = (long)t_5[0] << 0xd | r0_5 >> 0x33;
  auVar371 = auVar146 * auVar321 + auVar145 * auVar320 + auVar147 * auVar322 +
             auVar128 * auVar303 + auVar127 * auVar302 + auVar371;
  uVar392 = auVar371._0_8_;
  auVar372._8_8_ = 0;
  auVar372._0_8_ = auVar371._8_8_ << 0xd | uVar392 >> 0x33;
  auVar372 = auVar149 * auVar324 + auVar148 * auVar323 +
             auVar131 * auVar306 + auVar130 * auVar305 + auVar129 * auVar304 + auVar372;
  uVar405 = auVar372._0_8_;
  auVar373._8_8_ = 0;
  auVar373._0_8_ = auVar372._8_8_ << 0xd | uVar405 >> 0x33;
  auVar373 = auVar150 * auVar325 +
             auVar135 * auVar310 + auVar134 * auVar309 + auVar133 * auVar308 + auVar132 * auVar307 +
             auVar373;
  uVar406 = auVar373._0_8_;
  auVar374._8_8_ = 0;
  auVar374._0_8_ = auVar373._8_8_ << 0xd | uVar406 >> 0x33;
  auVar374 = auVar140 * auVar315 +
             auVar139 * auVar314 + auVar138 * auVar313 + auVar137 * auVar312 + auVar136 * auVar311 +
             auVar374;
  uVar380 = auVar374._0_8_;
  uVar393 = (r0_5 & 0x7ffffffffffff) + (auVar374._8_8_ << 0xd | uVar380 >> 0x33) * 0x13;
  r1_5 = uVar393 & 0x7ffffffffffff;
  r->z[0] = r1_5;
  r->z[1] = (uVar392 & 0x7ffffffffffff) + (uVar393 >> 0x33);
  r->z[2] = uVar405 & 0x7ffffffffffff;
  r->z[3] = uVar406 & 0x7ffffffffffff;
  r->z[4] = uVar380 & 0x7ffffffffffff;
  auVar151._8_8_ = 0;
  auVar151._0_8_ = uVar407;
  auVar326._8_8_ = 0;
  auVar326._0_8_ = uVar388;
  auVar152._8_8_ = 0;
  auVar152._0_8_ = uVar407;
  auVar327._8_8_ = 0;
  auVar327._0_8_ = uVar389;
  auVar153._8_8_ = 0;
  auVar153._0_8_ = uVar408;
  auVar328._8_8_ = 0;
  auVar328._0_8_ = uVar388;
  auVar154._8_8_ = 0;
  auVar154._0_8_ = uVar407;
  auVar329._8_8_ = 0;
  auVar329._0_8_ = uVar390;
  auVar155._8_8_ = 0;
  auVar155._0_8_ = uVar409;
  auVar330._8_8_ = 0;
  auVar330._0_8_ = uVar388;
  auVar156._8_8_ = 0;
  auVar156._0_8_ = uVar408;
  auVar331._8_8_ = 0;
  auVar331._0_8_ = uVar389;
  auVar157._8_8_ = 0;
  auVar157._0_8_ = uVar407;
  auVar332._8_8_ = 0;
  auVar332._0_8_ = uVar391;
  auVar158._8_8_ = 0;
  auVar158._0_8_ = uVar384;
  auVar333._8_8_ = 0;
  auVar333._0_8_ = uVar388;
  auVar159._8_8_ = 0;
  auVar159._0_8_ = uVar408;
  auVar334._8_8_ = 0;
  auVar334._0_8_ = uVar390;
  auVar160._8_8_ = 0;
  auVar160._0_8_ = uVar409;
  auVar335._8_8_ = 0;
  auVar335._0_8_ = uVar389;
  auVar161._8_8_ = 0;
  auVar161._0_8_ = uVar407;
  auVar336._8_8_ = 0;
  auVar336._0_8_ = uVar386;
  auVar162._8_8_ = 0;
  auVar162._0_8_ = uVar385;
  auVar337._8_8_ = 0;
  auVar337._0_8_ = uVar388;
  auVar163._8_8_ = 0;
  auVar163._0_8_ = uVar384;
  auVar338._8_8_ = 0;
  auVar338._0_8_ = uVar389;
  auVar164._8_8_ = 0;
  auVar164._0_8_ = uVar408;
  auVar339._8_8_ = 0;
  auVar339._0_8_ = uVar391;
  auVar165._8_8_ = 0;
  auVar165._0_8_ = uVar409;
  auVar340._8_8_ = 0;
  auVar340._0_8_ = uVar390;
  uVar384 = uVar384 * 0x13;
  uVar385 = uVar385 * 0x13;
  auVar166._8_8_ = 0;
  auVar166._0_8_ = uVar385;
  auVar341._8_8_ = 0;
  auVar341._0_8_ = uVar389;
  auVar167._8_8_ = 0;
  auVar167._0_8_ = uVar408 * 0x13;
  auVar342._8_8_ = 0;
  auVar342._0_8_ = uVar386;
  auVar168._8_8_ = 0;
  auVar168._0_8_ = uVar409 * 0x13;
  auVar343._8_8_ = 0;
  auVar343._0_8_ = uVar391;
  auVar169._8_8_ = 0;
  auVar169._0_8_ = uVar384;
  auVar344._8_8_ = 0;
  auVar344._0_8_ = uVar390;
  auVar1 = auVar167 * auVar342 + auVar166 * auVar341 + auVar168 * auVar343 + auVar169 * auVar344 +
           auVar151 * auVar326;
  auVar170._8_8_ = 0;
  auVar170._0_8_ = uVar385;
  auVar345._8_8_ = 0;
  auVar345._0_8_ = uVar390;
  auVar171._8_8_ = 0;
  auVar171._0_8_ = uVar409 * 0x13;
  auVar346._8_8_ = 0;
  auVar346._0_8_ = uVar386;
  auVar172._8_8_ = 0;
  auVar172._0_8_ = uVar384;
  auVar347._8_8_ = 0;
  auVar347._0_8_ = uVar391;
  auVar173._8_8_ = 0;
  auVar173._0_8_ = uVar385;
  auVar348._8_8_ = 0;
  auVar348._0_8_ = uVar391;
  auVar174._8_8_ = 0;
  auVar174._0_8_ = uVar384;
  auVar349._8_8_ = 0;
  auVar349._0_8_ = uVar386;
  auVar175._8_8_ = 0;
  auVar175._0_8_ = uVar385;
  auVar350._8_8_ = 0;
  auVar350._0_8_ = uVar386;
  r0_6 = auVar1._0_8_;
  t_6[0]._0_8_ = auVar1._8_8_;
  auVar375._8_8_ = 0;
  auVar375._0_8_ = (long)t_6[0] << 0xd | r0_6 >> 0x33;
  auVar375 = auVar171 * auVar346 + auVar170 * auVar345 + auVar172 * auVar347 +
             auVar153 * auVar328 + auVar152 * auVar327 + auVar375;
  uVar392 = auVar375._0_8_;
  auVar376._8_8_ = 0;
  auVar376._0_8_ = auVar375._8_8_ << 0xd | uVar392 >> 0x33;
  auVar376 = auVar174 * auVar349 + auVar173 * auVar348 +
             auVar156 * auVar331 + auVar155 * auVar330 + auVar154 * auVar329 + auVar376;
  uVar405 = auVar376._0_8_;
  auVar377._8_8_ = 0;
  auVar377._0_8_ = auVar376._8_8_ << 0xd | uVar405 >> 0x33;
  auVar377 = auVar175 * auVar350 +
             auVar160 * auVar335 + auVar159 * auVar334 + auVar158 * auVar333 + auVar157 * auVar332 +
             auVar377;
  uVar406 = auVar377._0_8_;
  auVar378._8_8_ = 0;
  auVar378._0_8_ = auVar377._8_8_ << 0xd | uVar406 >> 0x33;
  auVar378 = auVar165 * auVar340 +
             auVar164 * auVar339 + auVar163 * auVar338 + auVar162 * auVar337 + auVar161 * auVar336 +
             auVar378;
  uVar380 = auVar378._0_8_;
  uVar393 = (auVar378._8_8_ << 0xd | uVar380 >> 0x33) * 0x13 + (r0_6 & 0x7ffffffffffff);
  r->t[0] = uVar393 & 0x7ffffffffffff;
  r->t[1] = (uVar393 >> 0x33) + (uVar392 & 0x7ffffffffffff);
  r->t[2] = uVar405 & 0x7ffffffffffff;
  r->t[3] = uVar406 & 0x7ffffffffffff;
  r->t[4] = uVar380 & 0x7ffffffffffff;
  return;
}

Assistant:

static void
ge25519_nielsadd2(ge25519 *r, const ge25519_niels *q) {
	bignum25519 a,b,c,e,f,g,h;

	curve25519_sub(a, r->y, r->x);
	curve25519_add(b, r->y, r->x);
	curve25519_mul(a, a, q->ysubx);
	curve25519_mul(e, b, q->xaddy);
	curve25519_add(h, e, a);
	curve25519_sub(e, e, a);
	curve25519_mul(c, r->t, q->t2d);
	curve25519_add(f, r->z, r->z);
	curve25519_add_after_basic(g, f, c);
	curve25519_sub_after_basic(f, f, c);
	curve25519_mul(r->x, e, f);
	curve25519_mul(r->y, h, g);
	curve25519_mul(r->z, g, f);
	curve25519_mul(r->t, e, h);
}